

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O1

int64_t benchmarks::Memory::GetAvailablePhys(void)

{
  long lVar1;
  long lVar2;
  
  lVar1 = sysconf(0x56);
  lVar2 = sysconf(0x1e);
  return lVar2 * lVar1;
}

Assistant:

int64_t Memory::GetAvailablePhys()
	{
#if defined(_WIN32)

		MEMORYSTATUSEX status;
		status.dwLength = sizeof(status);
		if (!GlobalMemoryStatusEx(&status))
			return 0;
		return status.ullAvailPhys;

#elif defined(__APPLE__) && defined(__MACH__)

		mach_msg_type_number_t count = HOST_VM_INFO_COUNT;
		vm_statistics_data_t vmstat;
		if(host_statistics(mach_host_self(), HOST_VM_INFO, (host_info_t)&vmstat, &count) != KERN_SUCCESS)
			return 0;
		return int64_t(vmstat.pagesize) * int64_t(vmstat.free_count);

#elif defined(__linux__) || defined(__linux) || defined(linux) || defined(__gnu_linux__)

		int64_t pages = sysconf(_SC_AVPHYS_PAGES);
		int64_t page_size = sysconf(_SC_PAGE_SIZE);
		return pages * page_size;

#else

		return 0;

#endif
	}